

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gerr.hpp
# Opt level: O0

Error __thiscall
gerr::Make<fake::ErrArgumentZero,fake::ErrArgumentZero::__PrivateStruct__>
          (gerr *this,__PrivateStruct__ *args)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Error EVar1;
  undefined1 local_28 [8];
  shared_ptr<fake::ErrArgumentZero> p;
  __PrivateStruct__ *args_local;
  
  p.super___shared_ptr<fake::ErrArgumentZero,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)args;
  std::make_shared<fake::ErrArgumentZero,fake::ErrArgumentZero::__PrivateStruct__>
            ((__PrivateStruct__ *)local_28);
  std::static_pointer_cast<gerr::details::IError,fake::ErrArgumentZero>
            ((shared_ptr<fake::ErrArgumentZero> *)this);
  std::shared_ptr<fake::ErrArgumentZero>::~shared_ptr((shared_ptr<fake::ErrArgumentZero> *)local_28)
  ;
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Error)EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline Error Make(Args&&... args) {
  auto p = std::make_shared<ErrType>(std::forward<Args>(args)...);
  return std::static_pointer_cast<details::IError>(p);
}